

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Parser
parserCreate(XML_Char *encodingName,XML_Memory_Handling_Suite *memsuite,XML_Char *nameSep,DTD *dtd)

{
  XML_Memory_Handling_Suite *pXVar1;
  XML_Parser parser;
  code *pcVar2;
  ATTRIBUTE *pAVar3;
  XML_Char *pXVar4;
  DTD *pDVar5;
  ENCODING *pEVar6;
  code *pcVar7;
  
  if (memsuite == (XML_Memory_Handling_Suite *)0x0) {
    parser = (XML_Parser)malloc(0x380);
    if (parser == (XML_Parser)0x0) {
      return (XML_Parser)0x0;
    }
    pcVar2 = malloc;
    (parser->m_mem).malloc_fcn = malloc;
    (parser->m_mem).realloc_fcn = realloc;
    pcVar7 = free;
  }
  else {
    parser = (XML_Parser)(*memsuite->malloc_fcn)(0x380);
    if (parser == (XML_Parser)0x0) {
      return (XML_Parser)0x0;
    }
    pcVar2 = memsuite->malloc_fcn;
    (parser->m_mem).malloc_fcn = pcVar2;
    (parser->m_mem).realloc_fcn = memsuite->realloc_fcn;
    pcVar7 = memsuite->free_fcn;
  }
  (parser->m_mem).free_fcn = pcVar7;
  parser->m_buffer = (char *)0x0;
  parser->m_bufferLim = (char *)0x0;
  parser->m_attsSize = 0x10;
  pAVar3 = (ATTRIBUTE *)(*pcVar2)(0x200);
  parser->m_atts = pAVar3;
  if (pAVar3 != (ATTRIBUTE *)0x0) {
    pXVar4 = (XML_Char *)(*(parser->m_mem).malloc_fcn)(0x400);
    parser->m_dataBuf = pXVar4;
    if (pXVar4 != (XML_Char *)0x0) {
      parser->m_dataBufEnd = pXVar4 + 0x400;
      pDVar5 = (DTD *)(*(parser->m_mem).malloc_fcn)(0x140);
      if (pDVar5 != (DTD *)0x0) {
        pXVar1 = &parser->m_mem;
        (pDVar5->pool).end = (XML_Char *)0x0;
        (pDVar5->pool).ptr = (XML_Char *)0x0;
        (pDVar5->pool).blocks = (BLOCK *)0x0;
        (pDVar5->pool).freeBlocks = (BLOCK *)0x0;
        (pDVar5->pool).start = (XML_Char *)0x0;
        (pDVar5->pool).mem = pXVar1;
        (pDVar5->entityValuePool).blocks = (BLOCK *)0x0;
        (pDVar5->entityValuePool).freeBlocks = (BLOCK *)0x0;
        (pDVar5->entityValuePool).end = (XML_Char *)0x0;
        (pDVar5->entityValuePool).ptr = (XML_Char *)0x0;
        (pDVar5->entityValuePool).start = (XML_Char *)0x0;
        (pDVar5->entityValuePool).mem = pXVar1;
        (pDVar5->generalEntities).power = '\0';
        (pDVar5->generalEntities).v = (NAMED **)0x0;
        (pDVar5->generalEntities).size = 0;
        (pDVar5->generalEntities).used = 0;
        (pDVar5->generalEntities).mem = pXVar1;
        (pDVar5->elementTypes).power = '\0';
        (pDVar5->elementTypes).v = (NAMED **)0x0;
        (pDVar5->elementTypes).size = 0;
        (pDVar5->elementTypes).used = 0;
        (pDVar5->elementTypes).mem = pXVar1;
        (pDVar5->attributeIds).power = '\0';
        (pDVar5->attributeIds).v = (NAMED **)0x0;
        (pDVar5->attributeIds).size = 0;
        (pDVar5->attributeIds).used = 0;
        (pDVar5->attributeIds).mem = pXVar1;
        (pDVar5->prefixes).power = '\0';
        (pDVar5->prefixes).v = (NAMED **)0x0;
        (pDVar5->prefixes).size = 0;
        (pDVar5->prefixes).used = 0;
        (pDVar5->prefixes).mem = pXVar1;
        (pDVar5->defaultPrefix).name = (XML_Char *)0x0;
        (pDVar5->defaultPrefix).binding = (BINDING *)0x0;
        pDVar5->in_eldecl = '\0';
        pDVar5->scaffold = (CONTENT_SCAFFOLD *)0x0;
        pDVar5->contentStringLen = 0;
        pDVar5->scaffSize = 0;
        pDVar5->scaffCount = 0;
        pDVar5->scaffLevel = 0;
        pDVar5->scaffIndex = (int *)0x0;
        pDVar5->keepProcessing = '\x01';
        pDVar5->hasParamEntityRefs = '\0';
        pDVar5->standalone = '\0';
        parser->m_dtd = pDVar5;
        parser->m_freeBindingList = (BINDING *)0x0;
        parser->m_freeTagList = (TAG *)0x0;
        parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
        parser->m_groupSize = 0;
        parser->m_groupConnector = (char *)0x0;
        parser->m_unknownEncodingHandler = (XML_UnknownEncodingHandler)0x0;
        parser->m_unknownEncodingHandlerData = (void *)0x0;
        parser->m_namespaceSeparator = '!';
        parser->m_ns = '\0';
        parser->m_ns_triplets = '\0';
        parser->m_protocolEncodingName = (XML_Char *)0x0;
        (parser->m_tempPool).blocks = (BLOCK *)0x0;
        (parser->m_tempPool).freeBlocks = (BLOCK *)0x0;
        (parser->m_tempPool).end = (XML_Char *)0x0;
        (parser->m_tempPool).ptr = (XML_Char *)0x0;
        (parser->m_tempPool).start = (XML_Char *)0x0;
        parser->m_nsAtts = (NS_ATT *)0x0;
        parser->m_nsAttsVersion = 0;
        parser->m_nsAttsPower = '\0';
        (parser->m_tempPool).mem = pXVar1;
        (parser->m_temp2Pool).start = (XML_Char *)0x0;
        (parser->m_temp2Pool).end = (XML_Char *)0x0;
        (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
        (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
        (parser->m_temp2Pool).freeBlocks = (BLOCK *)0x0;
        (parser->m_temp2Pool).mem = pXVar1;
        parserInit(parser,encodingName);
        if ((encodingName != (XML_Char *)0x0) && (parser->m_protocolEncodingName == (XML_Char *)0x0)
           ) {
          XML_ParserFree(parser);
          return (XML_Parser)0x0;
        }
        if (nameSep == (XML_Char *)0x0) {
          pEVar6 = XmlGetUtf8InternalEncoding();
          parser->m_internalEncoding = pEVar6;
          return parser;
        }
        parser->m_ns = '\x01';
        pEVar6 = XmlGetUtf8InternalEncoding();
        parser->m_internalEncoding = pEVar6;
        parser->m_namespaceSeparator = *nameSep;
        return parser;
      }
      parser->m_dtd = (DTD *)0x0;
      (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
    }
    (*(parser->m_mem).free_fcn)(parser->m_atts);
  }
  (*(parser->m_mem).free_fcn)(parser);
  return (XML_Parser)0x0;
}

Assistant:

static XML_Parser
parserCreate(const XML_Char *encodingName,
             const XML_Memory_Handling_Suite *memsuite, const XML_Char *nameSep,
             DTD *dtd) {
  XML_Parser parser;

  if (memsuite) {
    XML_Memory_Handling_Suite *mtemp;
    parser = memsuite->malloc_fcn(sizeof(struct XML_ParserStruct));
    if (parser != NULL) {
      mtemp = (XML_Memory_Handling_Suite *)&(parser->m_mem);
      mtemp->malloc_fcn = memsuite->malloc_fcn;
      mtemp->realloc_fcn = memsuite->realloc_fcn;
      mtemp->free_fcn = memsuite->free_fcn;
    }
  } else {
    XML_Memory_Handling_Suite *mtemp;
    parser = (XML_Parser)malloc(sizeof(struct XML_ParserStruct));
    if (parser != NULL) {
      mtemp = (XML_Memory_Handling_Suite *)&(parser->m_mem);
      mtemp->malloc_fcn = malloc;
      mtemp->realloc_fcn = realloc;
      mtemp->free_fcn = free;
    }
  }

  if (! parser)
    return parser;

  parser->m_buffer = NULL;
  parser->m_bufferLim = NULL;

  parser->m_attsSize = INIT_ATTS_SIZE;
  parser->m_atts
      = (ATTRIBUTE *)MALLOC(parser, parser->m_attsSize * sizeof(ATTRIBUTE));
  if (parser->m_atts == NULL) {
    FREE(parser, parser);
    return NULL;
  }
#ifdef XML_ATTR_INFO
  parser->m_attInfo = (XML_AttrInfo *)MALLOC(
      parser, parser->m_attsSize * sizeof(XML_AttrInfo));
  if (parser->m_attInfo == NULL) {
    FREE(parser, parser->m_atts);
    FREE(parser, parser);
    return NULL;
  }
#endif
  parser->m_dataBuf
      = (XML_Char *)MALLOC(parser, INIT_DATA_BUF_SIZE * sizeof(XML_Char));
  if (parser->m_dataBuf == NULL) {
    FREE(parser, parser->m_atts);
#ifdef XML_ATTR_INFO
    FREE(parser, parser->m_attInfo);
#endif
    FREE(parser, parser);
    return NULL;
  }
  parser->m_dataBufEnd = parser->m_dataBuf + INIT_DATA_BUF_SIZE;

  if (dtd)
    parser->m_dtd = dtd;
  else {
    parser->m_dtd = dtdCreate(&parser->m_mem);
    if (parser->m_dtd == NULL) {
      FREE(parser, parser->m_dataBuf);
      FREE(parser, parser->m_atts);
#ifdef XML_ATTR_INFO
      FREE(parser, parser->m_attInfo);
#endif
      FREE(parser, parser);
      return NULL;
    }
  }

  parser->m_freeBindingList = NULL;
  parser->m_freeTagList = NULL;
  parser->m_freeInternalEntities = NULL;

  parser->m_groupSize = 0;
  parser->m_groupConnector = NULL;

  parser->m_unknownEncodingHandler = NULL;
  parser->m_unknownEncodingHandlerData = NULL;

  parser->m_namespaceSeparator = ASCII_EXCL;
  parser->m_ns = XML_FALSE;
  parser->m_ns_triplets = XML_FALSE;

  parser->m_nsAtts = NULL;
  parser->m_nsAttsVersion = 0;
  parser->m_nsAttsPower = 0;

  parser->m_protocolEncodingName = NULL;

  poolInit(&parser->m_tempPool, &(parser->m_mem));
  poolInit(&parser->m_temp2Pool, &(parser->m_mem));
  parserInit(parser, encodingName);

  if (encodingName && ! parser->m_protocolEncodingName) {
    XML_ParserFree(parser);
    return NULL;
  }

  if (nameSep) {
    parser->m_ns = XML_TRUE;
    parser->m_internalEncoding = XmlGetInternalEncodingNS();
    parser->m_namespaceSeparator = *nameSep;
  } else {
    parser->m_internalEncoding = XmlGetInternalEncoding();
  }

  return parser;
}